

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visitor.h
# Opt level: O2

void __thiscall
Eigen::DenseBase<Eigen::Matrix<float,32,1,0,32,1>>::
visit<Eigen::internal::max_coeff_visitor<Eigen::Matrix<float,32,1,0,32,1>>>
          (DenseBase<Eigen::Matrix<float,32,1,0,32,1>> *this,
          max_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_> *visitor)

{
  ThisEvaluator thisEval;
  visitor_evaluator<Eigen::Matrix<float,_32,_1,_0,_32,_1>_> local_18;
  
  local_18.m_evaluator.
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>_>.m_data =
       (Scalar *)this;
  local_18.m_xpr = (Matrix<float,_32,_1,_0,_32,_1> *)this;
  internal::
  visitor_impl<Eigen::internal::max_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>,_Eigen::internal::visitor_evaluator<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>,_32>
  ::run(&local_18,visitor);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC
void DenseBase<Derived>::visit(Visitor& visitor) const
{
  typedef typename internal::visitor_evaluator<Derived> ThisEvaluator;
  ThisEvaluator thisEval(derived());
  
  enum {
    unroll =  SizeAtCompileTime != Dynamic
           && SizeAtCompileTime * ThisEvaluator::CoeffReadCost + (SizeAtCompileTime-1) * internal::functor_traits<Visitor>::Cost <= EIGEN_UNROLLING_LIMIT
  };
  return internal::visitor_impl<Visitor, ThisEvaluator, unroll ? int(SizeAtCompileTime) : Dynamic>::run(thisEval, visitor);
}